

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PhysBCFunct.H
# Opt level: O2

void __thiscall
amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>
          (GpuBndryFuncFab<PeleLMCCFillExtDir> *this,Box *bx,FArrayBox *dest,int dcomp,int numcomp,
          Geometry *geom,Real time,Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcr,
          int bcomp,int orig_comp,FilfcFace *fillfunc)

{
  Box *pBVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  pointer pBVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ProbParm *pPVar11;
  ACParm *pAVar12;
  undefined8 uVar13;
  Real RVar14;
  undefined8 uVar15;
  Real RVar16;
  BCRec *pBVar17;
  undefined8 uVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  bool bVar23;
  int idim;
  uint uVar24;
  IndexType IVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  int iVar36;
  int iVar37;
  long lVar38;
  ulong uVar39;
  int iVar40;
  int iVar41;
  uint uVar42;
  ulong uVar43;
  GeometryData *pGVar44;
  Real *pRVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  int iVar51;
  ulong uVar52;
  ulong uVar53;
  byte bVar54;
  IntVect IVar55;
  IntVect IVar56;
  Box gdomain;
  int local_4d8;
  int local_498;
  Box bx_2;
  Dim3 local_440;
  uint local_434;
  int iStack_430;
  int iStack_42c;
  int local_428;
  int local_424 [4];
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  int aiStack_408 [2];
  IndexType IStack_400;
  uint local_3fc;
  undefined8 local_3f8;
  int local_3f0;
  int aiStack_3ec [6];
  int local_3d4;
  Real local_3d0;
  int local_3c8;
  uint local_3c4;
  Real local_3c0;
  int local_3b8;
  Real local_3b4;
  int local_3ac;
  uint local_3a8;
  undefined8 local_3a4;
  int local_39c;
  int local_398 [16];
  Real local_358;
  int local_350;
  Box bx_1;
  Box bx_8;
  int iStack_2cc;
  Dim3 local_2c0;
  undefined8 local_2b4;
  int local_2ac;
  int local_2a8;
  int local_2a4 [4];
  int iStack_294;
  int iStack_290;
  int iStack_28c;
  int aiStack_288 [4];
  pointer local_278;
  int local_270;
  int aiStack_26c [6];
  int local_254;
  Real local_250;
  int local_248;
  uint local_244;
  Real local_240;
  int local_238;
  Real local_234;
  int local_22c;
  uint local_228;
  undefined8 local_224;
  int local_21c;
  int local_218 [4];
  ulong local_208;
  int local_200;
  ulong local_1fc;
  int local_1f4;
  uint local_1f0;
  undefined8 local_1ec;
  int local_1e4;
  int local_1e0 [2];
  undefined8 local_1d8;
  int local_1d0;
  undefined4 uStack_1cc;
  int local_1c8;
  undefined8 local_1c4;
  int local_1bc;
  uint local_1b8;
  undefined8 local_1b4;
  int local_1ac;
  undefined8 local_1a8;
  int local_1a0;
  uint local_19c;
  Box tmp;
  int local_170 [3];
  Box local_160;
  Box local_140;
  Box local_120;
  Box local_100;
  Box local_e0;
  Box local_c4;
  GeometryData geomdata;
  
  bVar54 = 0;
  IVar55 = Box::length(bx);
  iVar32 = IVar55.vect[2];
  local_170[0] = IVar55.vect[0];
  local_170[1] = IVar55.vect[1];
  local_170[2] = IVar55.vect[2];
  uVar3 = (bx->btype).itype;
  uVar8 = *(undefined8 *)(geom->domain).smallend.vect;
  uVar9 = *(undefined8 *)((geom->domain).smallend.vect + 2);
  bx_1.bigend.vect[1] = (int)((ulong)*(undefined8 *)(geom->domain).bigend.vect >> 0x20);
  bx_1._20_8_ = *(undefined8 *)((geom->domain).bigend.vect + 2);
  bx_1.smallend.vect[0] = (int)uVar8;
  bx_1.smallend.vect[1] = SUB84(uVar8,4);
  bx_1.smallend.vect[2] = (int)uVar9;
  bx_1.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
  for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
    uVar24 = 1 << ((byte)lVar33 & 0x1f);
    uVar46 = (uint)lVar33;
    bx_1.bigend.vect[lVar33] =
         (bx_1.bigend.vect[lVar33] + (uint)((uVar3 >> (uVar46 & 0x1f) & 1) != 0)) -
         (uint)((bx_1.btype.itype >> (uVar46 & 0x1f) & 1) != 0);
    if ((uVar3 >> (uVar46 & 0x1f) & 1) == 0) {
      IVar25.itype = ~uVar24 & bx_1.btype.itype;
    }
    else {
      IVar25.itype = uVar24 | bx_1.btype.itype;
    }
    bx_1.btype.itype = IVar25.itype;
  }
  gdomain.bigend.vect[1] = bx_1.bigend.vect[1];
  gdomain.bigend.vect[2] = bx_1.bigend.vect[2];
  gdomain.smallend.vect[0] = (int)uVar8;
  gdomain.smallend.vect[1] = SUB84(uVar8,4);
  gdomain.smallend.vect[2] = bx_1.smallend.vect[2];
  gdomain.bigend.vect[0] = bx_1.bigend.vect[0];
  for (lVar33 = 0; lVar33 != 3; lVar33 = lVar33 + 1) {
    if (*(char *)((long)(geom->super_CoordSys).inv_dx + lVar33 + 0x19) == '\x01') {
      iVar4 = local_170[lVar33];
      piVar2 = gdomain.smallend.vect + lVar33;
      *piVar2 = *piVar2 - iVar4;
      piVar2 = gdomain.bigend.vect + lVar33;
      *piVar2 = *piVar2 + iVar4;
    }
  }
  gdomain.btype.itype = bx_1.btype.itype;
  local_170 = IVar55.vect;
  bVar23 = Box::contains(&gdomain,bx);
  if (!bVar23) {
    pdVar6 = (dest->super_BaseFab<double>).dptr;
    iVar4 = (dest->super_BaseFab<double>).nvar;
    pBVar1 = &(dest->super_BaseFab<double>).domain;
    iVar28 = (dest->super_BaseFab<double>).domain.smallend.vect[1];
    iVar19 = (pBVar1->smallend).vect[0];
    iVar20 = (pBVar1->smallend).vect[1];
    iVar5 = (dest->super_BaseFab<double>).domain.smallend.vect[2];
    lVar33 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[0];
    uVar53 = lVar33 + 1;
    lVar38 = (long)(dest->super_BaseFab<double>).domain.bigend.vect[1] + 1;
    iVar26 = (dest->super_BaseFab<double>).domain.bigend.vect[2] + 1;
    lVar33 = (lVar33 - (pBVar1->smallend).vect[0]) + 1;
    Geometry::data(geom);
    IStack_400.itype = gdomain.bigend.vect[2];
    aiStack_408[1] = gdomain.bigend.vect[1];
    iVar27 = gdomain.bigend.vect[0];
    iStack_40c = gdomain.smallend.vect[2];
    iStack_410 = gdomain.smallend.vect[1];
    pBVar7 = (bcr->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
             super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_4d8 = IVar55.vect[0];
    bx_2.btype.itype = gdomain.btype.itype & 0xfffffffe;
    bx_2.smallend.vect[0] = gdomain.smallend.vect[0] - local_4d8;
    bx_2.smallend.vect[1] = gdomain.smallend.vect[1];
    bx_2.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_2.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    bx_2.bigend.vect[1] = gdomain.bigend.vect[1];
    bx_2.bigend.vect[2] = gdomain.bigend.vect[2];
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      bx_2.bigend.vect[lVar34] =
           (bx_2.bigend.vect[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((bx_2.btype.itype >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        bx_2.btype.itype = ~uVar46 & bx_2.btype.itype;
      }
      else {
        bx_2.btype.itype = uVar46 | bx_2.btype.itype;
      }
    }
    uVar52 = lVar38 << 0x20 | uVar53 & 0xffffffff;
    uVar39 = (lVar38 - iVar28) * lVar33;
    local_498 = IVar55.vect[1];
    local_434 = gdomain.btype.itype & 0xfffffffd;
    local_440.y = gdomain.smallend.vect[1] + -1;
    local_440.x = gdomain.bigend.vect[0];
    local_440.z = gdomain.bigend.vect[2];
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      (&local_440.x)[lVar34] =
           ((&local_440.x)[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_434 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_434 = ~uVar46 & local_434;
      }
      else {
        local_434 = uVar46 | local_434;
      }
    }
    local_424[3] = gdomain.btype.itype & 0xfffffffb;
    iStack_430 = gdomain.smallend.vect[0];
    iStack_42c = gdomain.smallend.vect[1];
    local_428 = gdomain.smallend.vect[2] - iVar32;
    local_424[0] = gdomain.bigend.vect[0];
    local_424[1] = gdomain.bigend.vect[1];
    local_424[2] = gdomain.smallend.vect[2] + -1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      local_424[lVar34] =
           (local_424[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_424[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_424[3] = ~uVar46 & local_424[3];
      }
      else {
        local_424[3] = uVar46 | local_424[3];
      }
    }
    IVar56 = Box::type(&gdomain);
    aiStack_3ec[2] = gdomain.bigend.vect[2];
    iVar30 = gdomain.bigend.vect[1];
    aiStack_3ec[0] = gdomain.bigend.vect[0];
    local_3f0 = gdomain.smallend.vect[2];
    iVar28 = gdomain.smallend.vect[0];
    iStack_414 = (iVar27 - (IVar56.vect[0] & 1)) + 1;
    iVar27 = local_4d8 + -1;
    local_3fc = gdomain.btype.itype & 0xfffffffe;
    aiStack_408[0] = iVar27 + iStack_414;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      aiStack_408[lVar34] =
           (aiStack_408[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_3fc >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_3fc = ~uVar46 & local_3fc;
      }
      else {
        local_3fc = uVar46 | local_3fc;
      }
    }
    iVar49 = local_498 + -1;
    IVar56 = Box::type(&gdomain);
    iVar51 = gdomain.bigend.vect[2];
    iVar30 = iVar30 + (int)((IVar56.vect._0_8_ << 0x1f) >> 0x3f) + 1;
    aiStack_3ec[3] = gdomain.btype.itype & 0xfffffffd;
    local_3f8 = (pointer)CONCAT44(iVar30,iVar28);
    aiStack_3ec[1] = iVar30 + iVar49;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      aiStack_3ec[lVar34] =
           (aiStack_3ec[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)aiStack_3ec[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        aiStack_3ec[3] = ~uVar46 & aiStack_3ec[3];
      }
      else {
        aiStack_3ec[3] = uVar46 | aiStack_3ec[3];
      }
    }
    uVar8._4_4_ = gdomain.smallend.vect[1];
    uVar8._0_4_ = gdomain.smallend.vect[0];
    RVar14 = (Real)CONCAT44(gdomain.bigend.vect[1],gdomain.bigend.vect[0]);
    IVar56 = Box::type(&gdomain);
    local_3d4 = (iVar51 - (IVar56.vect[2] & 1)) + 1;
    iVar28 = iVar32 + -1;
    local_3c4 = gdomain.btype.itype & 0xfffffffb;
    aiStack_3ec._16_8_ = uVar8;
    local_3d0 = RVar14;
    local_3c8 = iVar28 + local_3d4;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_3d0 + lVar34 * 4) =
           (*(int *)((long)&local_3d0 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_3c4 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_3c4 = ~uVar46 & local_3c4;
      }
      else {
        local_3c4 = uVar46 | local_3c4;
      }
    }
    pBVar7 = pBVar7 + bcomp;
    for (lVar34 = 0; iVar37 = bx_8.bigend.vect[0], iVar40 = bx_8.smallend.vect[2],
        iVar51 = gdomain.bigend.vect[2], iVar30 = gdomain.bigend.vect[0],
        bx_8.smallend.vect[2] = (int)pdVar6, iVar21 = bx_8.smallend.vect[2],
        bx_8.bigend.vect[0] = (int)((ulong)pdVar6 >> 0x20), iVar22 = bx_8.bigend.vect[0],
        lVar34 != 0xa8; lVar34 = lVar34 + 0x1c) {
      uVar8 = *(undefined8 *)((long)bx_2.smallend.vect + lVar34);
      uVar9 = *(undefined8 *)((long)bx_2.smallend.vect + lVar34 + 8);
      uVar10 = *(undefined8 *)((long)bx_2.bigend.vect + lVar34 + 8);
      tmp.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)bx_2.bigend.vect + lVar34) >> 0x20);
      tmp.bigend.vect[2] = (int)uVar10;
      tmp.btype.itype = (uint)((ulong)uVar10 >> 0x20);
      tmp.smallend.vect[0] = (int)uVar8;
      tmp.smallend.vect[1] = (int)((ulong)uVar8 >> 0x20);
      tmp.smallend.vect[2] = (int)uVar9;
      tmp.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
      bx_8.smallend.vect[2] = iVar40;
      bx_8.bigend.vect[0] = iVar37;
      Box::operator&=(&tmp,bx);
      stack0xfffffffffffffd30 = uVar39;
      local_2c0.x = iVar19;
      local_2c0.y = iVar20;
      local_2c0.z = iVar5;
      local_2b4 = uVar52;
      local_2ac = iVar26;
      local_2a8 = iVar4;
      local_2a4[1] = dcomp;
      local_2a4[2] = numcomp;
      aiStack_288[0] = bx_1.bigend.vect[1];
      aiStack_288[1] = bx_1.bigend.vect[2];
      aiStack_288[2] = bx_1.btype.itype;
      local_2a4[3] = bx_1.smallend.vect[0];
      iStack_294 = bx_1.smallend.vect[1];
      iStack_290 = bx_1.smallend.vect[2];
      iStack_28c = bx_1.bigend.vect[0];
      local_278 = pBVar7;
      pPVar11 = (this->m_user_f).lprobparm;
      pAVar12 = (this->m_user_f).lacparm;
      aiStack_26c[3] = (int)((ulong)*(undefined8 *)((long)&(this->m_user_f).lacparm + 4) >> 0x20);
      aiStack_26c._16_8_ = *(undefined8 *)((long)&(this->m_user_f).lpmfdata + 4);
      local_270 = (int)pPVar11;
      aiStack_26c[0] = (int)((ulong)pPVar11 >> 0x20);
      aiStack_26c[1] = (int)pAVar12;
      aiStack_26c[2] = (int)((ulong)pAVar12 >> 0x20);
      pGVar44 = &geomdata;
      pRVar45 = &local_250;
      for (lVar35 = 0xf; lVar35 != 0; lVar35 = lVar35 + -1) {
        *pRVar45 = (pGVar44->prob_domain).xlo[0];
        pGVar44 = (GeometryData *)((long)pGVar44 + (ulong)bVar54 * -0x10 + 8);
        pRVar45 = pRVar45 + (ulong)bVar54 * -2 + 1;
      }
      local_1d0 = orig_comp;
      bx_8.smallend.vect[2] = iVar21;
      bx_8.bigend.vect[0] = iVar22;
      local_1d8 = time;
      bx_8.bigend.vect._4_8_ = lVar33;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_1_>
                (&tmp,(anon_class_288_10_b99250ba *)&bx_8);
    }
    iVar40 = gdomain.smallend.vect[1] + -1;
    bx_8.smallend.vect[0] = gdomain.smallend.vect[0] - local_4d8;
    bx_8.smallend.vect[1] = gdomain.smallend.vect[1] - local_498;
    bx_8.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_8.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    bx_8.bigend.vect[1] = iVar40;
    bx_8.bigend.vect[2] = gdomain.bigend.vect[2];
    bx_8.btype.itype = gdomain.btype.itype & 0xfffffffc;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      bx_8.bigend.vect[lVar34] =
           (bx_8.bigend.vect[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((bx_8.btype.itype >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        bx_8.btype.itype = ~uVar46 & bx_8.btype.itype;
      }
      else {
        bx_8.btype.itype = uVar46 | bx_8.btype.itype;
      }
    }
    IVar56 = Box::type(&gdomain);
    iVar36 = gdomain.bigend.vect[2];
    iVar29 = gdomain.bigend.vect[1];
    iVar37 = gdomain.smallend.vect[2];
    uVar24 = IVar56.vect[0] & 1;
    stack0xfffffffffffffd30 = CONCAT44((iVar30 - uVar24) + 1,bx_8.btype.itype);
    local_2c0.y = iVar40;
    local_2c0.x = (iVar30 - uVar24) + iVar27 + 1;
    local_2c0.z = iVar51;
    local_2b4._0_4_ = gdomain.btype.itype & 0xfffffffc;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      (&local_2c0.x)[lVar34] =
           ((&local_2c0.x)[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_2b4 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_2b4._0_4_ = ~uVar46 & (uint)local_2b4;
      }
      else {
        local_2b4._0_4_ = uVar46 | (uint)local_2b4;
      }
    }
    bx_2.btype.itype = gdomain.btype.itype & 0xfffffffe;
    iVar47 = gdomain.smallend.vect[0] - local_4d8;
    iVar41 = gdomain.smallend.vect[0] + -1;
    bx_2.smallend.vect[1] = gdomain.smallend.vect[1];
    bx_2.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_2.bigend.vect[1] = gdomain.bigend.vect[1];
    bx_2.bigend.vect[2] = gdomain.bigend.vect[2];
    bx_2.smallend.vect[0] = iVar47;
    bx_2.bigend.vect[0] = iVar41;
    IVar56 = Box::type(&bx_2);
    iVar31 = gdomain.bigend.vect[2];
    iVar48 = gdomain.bigend.vect[1];
    iVar50 = gdomain.bigend.vect[0];
    iVar40 = gdomain.smallend.vect[2];
    iVar51 = gdomain.smallend.vect[1];
    iVar30 = (int)((IVar56.vect._0_8_ << 0x1f) >> 0x3f);
    local_2b4 = CONCAT44(iVar47,(uint)local_2b4);
    local_2ac = iVar30 + iVar29 + 1;
    local_2a8 = iVar37;
    local_2a4[0] = iVar41;
    local_2a4[1] = iVar30 + iVar29 + iVar49 + 1;
    local_2a4[2] = iVar36;
    local_2a4[3] = bx_2.btype.itype & 0xfffffffd;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      local_2a4[lVar34] =
           (local_2a4[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_2a4[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_2a4[3] = ~uVar46 & local_2a4[3];
      }
      else {
        local_2a4[3] = uVar46 | local_2a4[3];
      }
    }
    IVar56 = Box::type(&gdomain);
    uVar24 = IVar56.vect[0] & 1;
    iVar36 = (iVar50 - uVar24) + 1;
    iVar50 = iVar27 + (iVar50 - uVar24) + 1;
    tmp.btype.itype = gdomain.btype.itype & 0xfffffffe;
    tmp.smallend.vect[1] = iVar51;
    tmp.smallend.vect[2] = iVar40;
    tmp.bigend.vect[1] = iVar48;
    tmp.bigend.vect[2] = iVar31;
    tmp.smallend.vect[0] = iVar36;
    tmp.bigend.vect[0] = iVar50;
    IVar56 = Box::type(&tmp);
    iVar29 = gdomain.bigend.vect[1];
    iVar37 = gdomain.bigend.vect[0];
    iVar51 = gdomain.smallend.vect[1];
    iVar30 = (int)((IVar56.vect._0_8_ << 0x1f) >> 0x3f);
    aiStack_288[3] = tmp.btype.itype & 0xfffffffd;
    iStack_294 = iVar36;
    iStack_290 = iVar30 + iVar48 + 1;
    iStack_28c = iVar40;
    aiStack_288[0] = iVar50;
    aiStack_288[2] = iVar31;
    aiStack_288[1] = iVar30 + iVar48 + iVar49 + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      aiStack_288[lVar34] =
           (aiStack_288[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)aiStack_288[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        aiStack_288[3] = ~uVar46 & aiStack_288[3];
      }
      else {
        aiStack_288[3] = uVar46 | aiStack_288[3];
      }
    }
    iVar40 = gdomain.smallend.vect[2] - iVar32;
    iVar30 = gdomain.smallend.vect[2] + -1;
    aiStack_26c[3] = gdomain.btype.itype & 0xfffffffa;
    local_278 = (pointer)CONCAT44(gdomain.smallend.vect[1],gdomain.smallend.vect[0] - local_4d8);
    local_270 = iVar40;
    aiStack_26c[0] = gdomain.smallend.vect[0] + -1;
    aiStack_26c[1] = gdomain.bigend.vect[1];
    aiStack_26c[2] = iVar30;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      aiStack_26c[lVar34] =
           (aiStack_26c[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)aiStack_26c[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        aiStack_26c[3] = ~uVar46 & aiStack_26c[3];
      }
      else {
        aiStack_26c[3] = uVar46 | aiStack_26c[3];
      }
    }
    IVar56 = Box::type(&gdomain);
    iVar36 = gdomain.bigend.vect[2];
    iVar37 = iVar37 - (IVar56.vect[0] & 1);
    aiStack_26c[5] = iVar51;
    aiStack_26c[4] = iVar37 + 1;
    local_244 = gdomain.btype.itype & 0xfffffffa;
    local_254 = iVar40;
    local_250 = (Real)CONCAT44(iVar29,iVar27 + iVar37 + 1);
    local_248 = iVar30;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_250 + lVar34 * 4) =
           (*(int *)((long)&local_250 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_244 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_244 = ~uVar46 & local_244;
      }
      else {
        local_244 = uVar46 | local_244;
      }
    }
    local_100.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_100.smallend.vect[0] = gdomain.smallend.vect[0] - local_4d8;
    local_100.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    local_100.smallend.vect[1] = gdomain.smallend.vect[1];
    local_100.smallend.vect[2] = gdomain.smallend.vect[2];
    local_100.bigend.vect[1] = gdomain.bigend.vect[1];
    local_100.bigend.vect[2] = gdomain.bigend.vect[2];
    RVar14 = (Real)CONCAT44(gdomain.smallend.vect[1],local_100.smallend.vect[0]);
    RVar16 = (Real)CONCAT44(gdomain.bigend.vect[1],local_100.bigend.vect[0]);
    IVar56 = Box::type(&local_100);
    iVar51 = gdomain.bigend.vect[2];
    local_218[1] = gdomain.bigend.vect[1];
    iVar30 = gdomain.bigend.vect[0];
    local_120.smallend.vect[2] = gdomain.smallend.vect[2];
    local_120.smallend.vect[1] = gdomain.smallend.vect[1];
    iVar36 = iVar36 - (IVar56.vect[2] & 1);
    local_228 = local_100.btype.itype & 0xfffffffb;
    local_240 = RVar14;
    local_238 = iVar36 + 1;
    local_234 = RVar16;
    local_22c = iVar28 + iVar36 + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_234 + lVar34 * 4) =
           (*(int *)((long)&local_234 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_228 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_228 = ~uVar46 & local_228;
      }
      else {
        local_228 = uVar46 | local_228;
      }
    }
    IVar56 = Box::type(&gdomain);
    uVar24 = IVar56.vect[0] & 1;
    local_120.smallend.vect[0] = (iVar30 - uVar24) + 1;
    iVar37 = (iVar30 - uVar24) + iVar27 + 1;
    local_120.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_120.bigend.vect[1] = local_218[1];
    local_120.bigend.vect[2] = iVar51;
    uVar9._4_4_ = local_120.smallend.vect[1];
    uVar9._0_4_ = local_120.smallend.vect[0];
    local_120.bigend.vect[0] = iVar37;
    IVar56 = Box::type(&local_120);
    iVar40 = gdomain.bigend.vect[1];
    local_1e0[0] = gdomain.bigend.vect[0];
    iVar30 = gdomain.smallend.vect[0];
    iVar51 = iVar51 - (IVar56.vect[2] & 1);
    local_218[3] = local_120.btype.itype & 0xfffffffb;
    local_224 = uVar9;
    local_21c = iVar51 + 1;
    local_218[0] = iVar37;
    local_218[2] = iVar28 + iVar51 + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      local_218[lVar34] =
           (local_218[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_218[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_218[3] = ~uVar46 & local_218[3];
      }
      else {
        local_218[3] = uVar46 | local_218[3];
      }
    }
    uVar43 = IVar55.vect._0_8_ & 0xffffffff00000000;
    iVar51 = gdomain.smallend.vect[2] - iVar32;
    iVar37 = gdomain.smallend.vect[2] + -1;
    local_1f0 = gdomain.btype.itype & 0xfffffff9;
    local_208 = CONCAT44(gdomain.smallend.vect[1],gdomain.smallend.vect[0]) - uVar43 &
                0xffffffff00000000 | (ulong)(uint)gdomain.smallend.vect[0];
    local_200 = iVar51;
    local_1fc = ((ulong)(uint)gdomain.smallend.vect[1] << 0x20) - 0x100000000 |
                (ulong)(uint)gdomain.bigend.vect[0];
    local_1f4 = iVar37;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_1fc + lVar34 * 4) =
           (*(int *)((long)&local_1fc + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_1f0 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_1f0 = ~uVar46 & local_1f0;
      }
      else {
        local_1f0 = uVar46 | local_1f0;
      }
    }
    IVar55 = Box::type(&gdomain);
    iVar36 = gdomain.bigend.vect[2];
    iVar29 = gdomain.smallend.vect[0];
    iVar50 = (int)((IVar55.vect._0_8_ << 0x1f) >> 0x3f);
    local_1ec._4_4_ = iVar40 + iVar50 + 1;
    local_1ec._0_4_ = iVar30;
    uVar24 = gdomain.btype.itype & 0xfffffff9;
    local_1e4 = iVar51;
    local_1e0[1] = iVar40 + iVar50 + iVar49 + 1;
    local_1d8 = (Real)(CONCAT44(gdomain.btype.itype,iVar37) & 0xfffffff9ffffffff);
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar42 = 1 << ((byte)lVar34 & 0x1f);
      uVar46 = (uint)lVar34;
      local_1e0[lVar34] =
           (local_1e0[lVar34] + (uint)((uVar3 >> (uVar46 & 0x1f) & 1) != 0)) -
           (uint)((uVar24 >> (uVar46 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar46 & 0x1f) & 1) == 0) {
        uVar24 = ~uVar42 & local_1d8._4_4_;
      }
      else {
        uVar24 = uVar42 | local_1d8._4_4_;
      }
      local_1d8 = (Real)CONCAT44(uVar24,(undefined4)local_1d8);
    }
    local_140.btype.itype = gdomain.btype.itype & 0xfffffffd;
    iVar40 = gdomain.smallend.vect[1] - local_498;
    local_140.bigend.vect[1] = gdomain.smallend.vect[1] + -1;
    local_140.smallend.vect[0] = gdomain.smallend.vect[0];
    local_140.smallend.vect[2] = gdomain.smallend.vect[2];
    local_140.bigend.vect[0] = gdomain.bigend.vect[0];
    local_140.bigend.vect[2] = gdomain.bigend.vect[2];
    uVar8 = CONCAT44(local_140.bigend.vect[1],gdomain.bigend.vect[0]);
    local_140.smallend.vect[1] = iVar40;
    IVar55 = Box::type(&local_140);
    iVar51 = gdomain.bigend.vect[2];
    iVar30 = gdomain.bigend.vect[1];
    local_160.bigend.vect[0] = gdomain.bigend.vect[0];
    local_160.smallend.vect[2] = gdomain.smallend.vect[2];
    local_160.smallend.vect[0] = gdomain.smallend.vect[0];
    uVar24 = IVar55.vect[2] & 1;
    local_1b8 = local_140.btype.itype & 0xfffffffb;
    local_1d0 = iVar29;
    uStack_1cc = iVar40;
    local_1c8 = (iVar36 - uVar24) + 1;
    local_1c4 = uVar8;
    local_1bc = iVar28 + (iVar36 - uVar24) + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_1c4 + lVar34 * 4) =
           (*(int *)((long)&local_1c4 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_1b8 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_1b8 = ~uVar46 & local_1b8;
      }
      else {
        local_1b8 = uVar46 | local_1b8;
      }
    }
    IVar55 = Box::type(&gdomain);
    iVar40 = (int)((IVar55.vect._0_8_ << 0x1f) >> 0x3f);
    local_160.smallend.vect[1] = iVar40 + iVar30 + 1;
    local_160.bigend.vect[1] = iVar30 + iVar40 + iVar49 + 1;
    local_160.btype.itype = gdomain.btype.itype & 0xfffffffd;
    local_160.bigend.vect[2] = iVar51;
    uVar8 = CONCAT44(local_160.smallend.vect[1],local_160.smallend.vect[0]);
    uVar9 = CONCAT44(local_160.bigend.vect[1],local_160.bigend.vect[0]);
    IVar55 = Box::type(&local_160);
    uVar24 = IVar55.vect[2] & 1;
    local_19c = local_160.btype.itype & 0xfffffffb;
    local_1b4 = uVar8;
    local_1ac = (iVar51 - uVar24) + 1;
    local_1a8 = uVar9;
    local_1a0 = iVar28 + (iVar51 - uVar24) + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_1a8 + lVar34 * 4) =
           (*(int *)((long)&local_1a8 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_19c >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_19c = ~uVar46 & local_19c;
      }
      else {
        local_19c = uVar46 | local_19c;
      }
    }
    for (lVar34 = 0; iVar30 = gdomain.bigend.vect[0], lVar34 != 0x150; lVar34 = lVar34 + 0x1c) {
      uVar8 = *(undefined8 *)((long)bx_8.smallend.vect + lVar34);
      uVar9 = *(undefined8 *)((long)bx_8.smallend.vect + lVar34 + 8);
      uVar10 = *(undefined8 *)((long)bx_8.bigend.vect + lVar34 + 8);
      tmp.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)bx_8.bigend.vect + lVar34) >> 0x20);
      tmp.bigend.vect[2] = (int)uVar10;
      tmp.btype.itype = (uint)((ulong)uVar10 >> 0x20);
      tmp.smallend.vect[0] = (int)uVar8;
      tmp.smallend.vect[1] = (int)((ulong)uVar8 >> 0x20);
      tmp.smallend.vect[2] = (int)uVar9;
      tmp.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
      Box::operator&=(&tmp,bx);
      bx_2.btype.itype = (uint)uVar39;
      local_440.x = iVar19;
      local_440.y = iVar20;
      local_440.z = iVar5;
      local_434 = (uint)uVar53;
      iStack_430 = (int)lVar38;
      iStack_42c = iVar26;
      local_428 = iVar4;
      local_424[1] = dcomp;
      local_424[2] = numcomp;
      aiStack_408[0] = bx_1.bigend.vect[1];
      aiStack_408[1] = bx_1.bigend.vect[2];
      IStack_400.itype = bx_1.btype.itype;
      local_424[3] = bx_1.smallend.vect[0];
      iStack_414 = bx_1.smallend.vect[1];
      iStack_410 = bx_1.smallend.vect[2];
      iStack_40c = bx_1.bigend.vect[0];
      local_3f8 = pBVar7;
      pPVar11 = (this->m_user_f).lprobparm;
      pAVar12 = (this->m_user_f).lacparm;
      aiStack_3ec[3] = (int)((ulong)*(undefined8 *)((long)&(this->m_user_f).lacparm + 4) >> 0x20);
      aiStack_3ec._16_8_ = *(undefined8 *)((long)&(this->m_user_f).lpmfdata + 4);
      local_3f0 = (int)pPVar11;
      aiStack_3ec[0] = (int)((ulong)pPVar11 >> 0x20);
      aiStack_3ec[1] = (int)pAVar12;
      aiStack_3ec[2] = (int)((ulong)pAVar12 >> 0x20);
      pGVar44 = &geomdata;
      pRVar45 = &local_3d0;
      for (lVar35 = 0xf; lVar35 != 0; lVar35 = lVar35 + -1) {
        *pRVar45 = (pGVar44->prob_domain).xlo[0];
        pGVar44 = (GeometryData *)((long)pGVar44 + (ulong)bVar54 * -0x10 + 8);
        pRVar45 = pRVar45 + (ulong)bVar54 * -2 + 1;
      }
      local_350 = orig_comp;
      bx_2.smallend.vect[2] = iVar21;
      bx_2.bigend.vect[0] = iVar22;
      local_358 = time;
      bx_2.bigend.vect._4_8_ = lVar33;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_2_>
                (&tmp,(anon_class_288_10_b99250ba *)&bx_2);
    }
    bx_2.smallend.vect[1] =
         (int)(CONCAT44(gdomain.smallend.vect[1],gdomain.smallend.vect[0]) - uVar43 >> 0x20);
    uVar53 = ((ulong)(uint)gdomain.smallend.vect[1] << 0x20) - 0x100000000;
    iVar51 = gdomain.smallend.vect[2] + -1;
    bx_2.btype.itype = gdomain.btype.itype & 0xfffffff8;
    bx_2.smallend.vect[0] = gdomain.smallend.vect[0] - local_4d8;
    bx_2.smallend.vect[2] = gdomain.smallend.vect[2] - iVar32;
    bx_2.bigend.vect[0] = gdomain.smallend.vect[0] + -1;
    bx_2.bigend.vect[1] = (int)(uVar53 >> 0x20);
    bx_2.bigend.vect[2] = iVar51;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      bx_2.bigend.vect[lVar34] =
           (bx_2.bigend.vect[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((bx_2.btype.itype >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        bx_2.btype.itype = ~uVar46 & bx_2.btype.itype;
      }
      else {
        bx_2.btype.itype = uVar46 | bx_2.btype.itype;
      }
    }
    IVar55 = Box::type(&gdomain);
    iVar37 = gdomain.bigend.vect[1];
    iVar40 = gdomain.smallend.vect[2];
    uVar53 = uVar53 | iVar27 + (iVar30 - (IVar55.vect[0] & 1)) + 1;
    local_434 = gdomain.btype.itype & 0xfffffff8;
    local_440.x = (int)uVar53;
    local_440.y = (int)(uVar53 >> 0x20);
    local_440.z = iVar51;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      (&local_440.x)[lVar34] =
           ((&local_440.x)[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_434 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_434 = ~uVar46 & local_434;
      }
      else {
        local_434 = uVar46 | local_434;
      }
    }
    iVar41 = gdomain.smallend.vect[0] - local_4d8;
    iVar31 = gdomain.smallend.vect[0] + -1;
    bx_8.smallend.vect[1] = gdomain.smallend.vect[1];
    bx_8.smallend.vect[2] = gdomain.smallend.vect[2];
    bx_8.bigend.vect[1] = gdomain.bigend.vect[1];
    bx_8.bigend.vect[2] = gdomain.bigend.vect[2];
    stack0xfffffffffffffd30 = CONCAT44(iStack_2cc,gdomain.btype.itype) & 0xfffffffffffffffe;
    bx_8.smallend.vect[0] = iVar41;
    bx_8.bigend.vect[0] = iVar31;
    IVar55 = Box::type(&bx_8);
    iVar50 = gdomain.bigend.vect[2];
    iVar36 = gdomain.bigend.vect[1];
    iVar29 = gdomain.bigend.vect[0];
    iVar51 = gdomain.smallend.vect[2];
    iVar30 = gdomain.smallend.vect[1];
    iVar48 = (int)((IVar55.vect._0_8_ << 0x1f) >> 0x3f);
    local_424[3] = bx_8.btype.itype & 0xfffffff9;
    iStack_430 = iVar41;
    iStack_42c = iVar48 + iVar37 + 1;
    local_428 = iVar40 - iVar32;
    local_424[0] = iVar31;
    local_424[1] = iVar37 + iVar48 + iVar49 + 1;
    local_424[2] = iVar40 + -1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      local_424[lVar34] =
           (local_424[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_424[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_424[3] = ~uVar46 & local_424[3];
      }
      else {
        local_424[3] = uVar46 | local_424[3];
      }
    }
    IVar55 = Box::type(&gdomain);
    uVar24 = IVar55.vect[0] & 1;
    iVar48 = (iVar29 - uVar24) + 1;
    iVar40 = iVar27 + (iVar29 - uVar24) + 1;
    tmp.btype.itype = gdomain.btype.itype & 0xfffffffe;
    tmp.smallend.vect[1] = iVar30;
    tmp.smallend.vect[2] = iVar51;
    tmp.bigend.vect[1] = iVar36;
    tmp.bigend.vect[2] = iVar50;
    tmp.smallend.vect[0] = iVar48;
    tmp.bigend.vect[0] = iVar40;
    IVar55 = Box::type(&tmp);
    iVar30 = gdomain.bigend.vect[2];
    iVar37 = (int)((IVar55.vect._0_8_ << 0x1f) >> 0x3f);
    local_3fc = tmp.btype.itype & 0xfffffff9;
    iStack_414 = iVar48;
    iStack_410 = iVar37 + iVar36 + 1;
    iStack_40c = iVar51 - iVar32;
    aiStack_408[0] = iVar40;
    aiStack_408[1] = iVar36 + iVar37 + iVar49 + 1;
    IStack_400.itype = iVar51 - 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      aiStack_408[lVar34] =
           (aiStack_408[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_3fc >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_3fc = ~uVar46 & local_3fc;
      }
      else {
        local_3fc = uVar46 | local_3fc;
      }
    }
    local_100.smallend.vect[0] = gdomain.smallend.vect[0] - local_4d8;
    iVar29 = gdomain.smallend.vect[0] + -1;
    local_100.smallend.vect[1] = gdomain.smallend.vect[1] - local_498;
    iVar36 = gdomain.smallend.vect[1] + -1;
    local_100.btype.itype = gdomain.btype.itype & 0xfffffffc;
    local_100.smallend.vect[2] = gdomain.smallend.vect[2];
    local_100.bigend.vect[2] = gdomain.bigend.vect[2];
    pBVar17 = (BCRec *)CONCAT44(local_100.smallend.vect[1],local_100.smallend.vect[0]);
    local_100.bigend.vect[0] = iVar29;
    local_100.bigend.vect[1] = iVar36;
    IVar55 = Box::type(&local_100);
    iVar37 = gdomain.bigend.vect[2];
    iVar40 = gdomain.bigend.vect[0];
    iVar51 = gdomain.smallend.vect[2];
    iVar32 = gdomain.smallend.vect[1];
    uVar24 = IVar55.vect[2] & 1;
    aiStack_3ec[3] = local_100.btype.itype & 0xfffffffb;
    local_3f8 = pBVar17;
    local_3f0 = (iVar30 - uVar24) + 1;
    aiStack_3ec[0] = iVar29;
    aiStack_3ec[1] = iVar36;
    aiStack_3ec[2] = iVar28 + (iVar30 - uVar24) + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      aiStack_3ec[lVar34] =
           (aiStack_3ec[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)aiStack_3ec[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        aiStack_3ec[3] = ~uVar46 & aiStack_3ec[3];
      }
      else {
        aiStack_3ec[3] = uVar46 | aiStack_3ec[3];
      }
    }
    IVar55 = Box::type(&gdomain);
    uVar24 = IVar55.vect[0] & 1;
    local_120.smallend.vect[0] = (iVar40 - uVar24) + 1;
    local_120.bigend.vect[0] = (iVar40 - uVar24) + iVar27 + 1;
    local_120.smallend.vect[1] = iVar32 - local_498;
    local_120.bigend.vect[1] = iVar32 + -1;
    local_120.btype.itype = gdomain.btype.itype & 0xfffffffc;
    local_120.smallend.vect[2] = iVar51;
    local_120.bigend.vect[2] = iVar37;
    uVar10._4_4_ = local_120.smallend.vect[1];
    uVar10._0_4_ = local_120.smallend.vect[0];
    RVar14 = (Real)CONCAT44(local_120.bigend.vect[1],local_120.bigend.vect[0]);
    IVar55 = Box::type(&local_120);
    iVar51 = gdomain.bigend.vect[2];
    iVar30 = gdomain.bigend.vect[1];
    iVar32 = gdomain.smallend.vect[2];
    uVar24 = IVar55.vect[2] & 1;
    local_3c4 = local_120.btype.itype & 0xfffffffb;
    aiStack_3ec._16_8_ = uVar10;
    local_3d4 = (iVar37 - uVar24) + 1;
    local_3d0 = RVar14;
    local_3c8 = iVar28 + (iVar37 - uVar24) + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_3d0 + lVar34 * 4) =
           (*(int *)((long)&local_3d0 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_3c4 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_3c4 = ~uVar46 & local_3c4;
      }
      else {
        local_3c4 = uVar46 | local_3c4;
      }
    }
    local_4d8 = gdomain.smallend.vect[0] - local_4d8;
    iVar37 = gdomain.smallend.vect[0] + -1;
    local_160.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_160.smallend.vect[1] = gdomain.smallend.vect[1];
    local_160.smallend.vect[2] = gdomain.smallend.vect[2];
    local_160.bigend.vect[1] = gdomain.bigend.vect[1];
    local_160.bigend.vect[2] = gdomain.bigend.vect[2];
    local_160.smallend.vect[0] = local_4d8;
    local_160.bigend.vect[0] = iVar37;
    IVar55 = Box::type(&local_160);
    iVar40 = (int)((IVar55.vect._0_8_ << 0x1f) >> 0x3f);
    local_140.smallend.vect[1] = iVar40 + iVar30 + 1;
    local_140.bigend.vect[1] = iVar30 + iVar40 + iVar49 + 1;
    local_140.btype.itype = local_160.btype.itype & 0xfffffffd;
    local_140.smallend.vect[2] = iVar32;
    local_140.bigend.vect[2] = iVar51;
    RVar14 = (Real)CONCAT44(local_140.smallend.vect[1],local_4d8);
    RVar16 = (Real)CONCAT44(local_140.bigend.vect[1],iVar37);
    local_140.smallend.vect[0] = local_4d8;
    local_140.bigend.vect[0] = iVar37;
    IVar55 = Box::type(&local_140);
    iVar40 = gdomain.bigend.vect[2];
    iVar30 = gdomain.bigend.vect[1];
    iVar32 = gdomain.bigend.vect[0];
    local_e0.smallend.vect[2] = gdomain.smallend.vect[2];
    uVar24 = IVar55.vect[2] & 1;
    local_3a8 = local_140.btype.itype & 0xfffffffb;
    local_3c0 = RVar14;
    local_3b8 = (iVar51 - uVar24) + 1;
    local_3b4 = RVar16;
    local_3ac = iVar28 + (iVar51 - uVar24) + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      *(uint *)((long)&local_3b4 + lVar34 * 4) =
           (*(int *)((long)&local_3b4 + lVar34 * 4) + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)((local_3a8 >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_3a8 = ~uVar46 & local_3a8;
      }
      else {
        local_3a8 = uVar46 | local_3a8;
      }
    }
    uVar13._4_4_ = gdomain.smallend.vect[2];
    uVar13._0_4_ = gdomain.smallend.vect[1];
    uVar15._4_4_ = gdomain.bigend.vect[2];
    uVar15._0_4_ = gdomain.bigend.vect[1];
    IVar55 = Box::type(&gdomain);
    uVar24 = IVar55.vect[0] & 1;
    iVar51 = (iVar32 - uVar24) + 1;
    iVar27 = (iVar32 - uVar24) + iVar27 + 1;
    local_c4.btype.itype = gdomain.btype.itype & 0xfffffffe;
    local_c4.smallend.vect[0] = iVar51;
    local_c4.smallend.vect._4_8_ = uVar13;
    local_c4.bigend.vect[0] = iVar27;
    local_c4.bigend.vect._4_8_ = uVar15;
    IVar55 = Box::type(&local_c4);
    iVar32 = (int)((IVar55.vect._0_8_ << 0x1f) >> 0x3f);
    local_e0.smallend.vect[1] = iVar32 + iVar30 + 1;
    iVar32 = iVar30 + iVar32 + iVar49 + 1;
    local_e0.btype.itype = local_c4.btype.itype & 0xfffffffd;
    local_e0.bigend.vect[2] = iVar40;
    uVar18._4_4_ = local_e0.smallend.vect[1];
    uVar18._0_4_ = iVar51;
    local_e0.smallend.vect[0] = iVar51;
    local_e0.bigend.vect[0] = iVar27;
    local_e0.bigend.vect[1] = iVar32;
    IVar55 = Box::type(&local_e0);
    uVar24 = IVar55.vect[2] & 1;
    local_398[3] = local_e0.btype.itype & 0xfffffffb;
    local_3a4 = uVar18;
    local_39c = (iVar40 - uVar24) + 1;
    local_398[0] = iVar27;
    local_398[1] = iVar32;
    local_398[2] = iVar28 + (iVar40 - uVar24) + 1;
    for (lVar34 = 0; lVar34 != 3; lVar34 = lVar34 + 1) {
      uVar46 = 1 << ((byte)lVar34 & 0x1f);
      uVar24 = (uint)lVar34;
      local_398[lVar34] =
           (local_398[lVar34] + (uint)((uVar3 >> (uVar24 & 0x1f) & 1) != 0)) -
           (uint)(((uint)local_398[3] >> (uVar24 & 0x1f) & 1) != 0);
      if ((uVar3 >> (uVar24 & 0x1f) & 1) == 0) {
        local_398[3] = ~uVar46 & local_398[3];
      }
      else {
        local_398[3] = uVar46 | local_398[3];
      }
    }
    for (lVar34 = 0; lVar34 != 0xe0; lVar34 = lVar34 + 0x1c) {
      uVar8 = *(undefined8 *)((long)bx_2.smallend.vect + lVar34);
      uVar9 = *(undefined8 *)((long)bx_2.smallend.vect + lVar34 + 8);
      uVar10 = *(undefined8 *)((long)bx_2.bigend.vect + lVar34 + 8);
      tmp.bigend.vect[1] = (int)((ulong)*(undefined8 *)((long)bx_2.bigend.vect + lVar34) >> 0x20);
      tmp.bigend.vect[2] = (int)uVar10;
      tmp.btype.itype = (uint)((ulong)uVar10 >> 0x20);
      tmp.smallend.vect[0] = (int)uVar8;
      tmp.smallend.vect[1] = (int)((ulong)uVar8 >> 0x20);
      tmp.smallend.vect[2] = (int)uVar9;
      tmp.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
      Box::operator&=(&tmp,bx);
      stack0xfffffffffffffd30 = uVar39;
      local_2c0.x = iVar19;
      local_2c0.y = iVar20;
      local_2c0.z = iVar5;
      local_2b4 = uVar52;
      local_2ac = iVar26;
      local_2a8 = iVar4;
      local_2a4[1] = dcomp;
      local_2a4[2] = numcomp;
      aiStack_288[0] = bx_1.bigend.vect[1];
      aiStack_288[1] = bx_1.bigend.vect[2];
      aiStack_288[2] = bx_1.btype.itype;
      local_2a4[3] = bx_1.smallend.vect[0];
      iStack_294 = bx_1.smallend.vect[1];
      iStack_290 = bx_1.smallend.vect[2];
      iStack_28c = bx_1.bigend.vect[0];
      local_278 = pBVar7;
      pPVar11 = (this->m_user_f).lprobparm;
      pAVar12 = (this->m_user_f).lacparm;
      aiStack_26c[3] = (int)((ulong)*(undefined8 *)((long)&(this->m_user_f).lacparm + 4) >> 0x20);
      aiStack_26c._16_8_ = *(undefined8 *)((long)&(this->m_user_f).lpmfdata + 4);
      local_270 = (int)pPVar11;
      aiStack_26c[0] = (int)((ulong)pPVar11 >> 0x20);
      aiStack_26c[1] = (int)pAVar12;
      aiStack_26c[2] = (int)((ulong)pAVar12 >> 0x20);
      pGVar44 = &geomdata;
      pRVar45 = &local_250;
      for (lVar38 = 0xf; lVar38 != 0; lVar38 = lVar38 + -1) {
        *pRVar45 = (pGVar44->prob_domain).xlo[0];
        pGVar44 = (GeometryData *)((long)pGVar44 + (ulong)bVar54 * -0x10 + 8);
        pRVar45 = pRVar45 + (ulong)bVar54 * -2 + 1;
      }
      local_1d0 = orig_comp;
      bx_8.smallend.vect[2] = iVar21;
      bx_8.bigend.vect[0] = iVar22;
      local_1d8 = time;
      bx_8.bigend.vect._4_8_ = lVar33;
      For<amrex::GpuBndryFuncFab<PeleLMCCFillExtDir>::ccfcdoit<amrex::FilfcFace>(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::Geometry_const&,double,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int,int,amrex::FilfcFace&&)::_lambda(int,int,int)_3_>
                (&tmp,(anon_class_288_10_b99250ba *)&bx_8);
    }
  }
  return;
}

Assistant:

void
GpuBndryFuncFab<F>::ccfcdoit (Box const& bx, FArrayBox& dest,
                              const int dcomp, const int numcomp,
                              Geometry const& geom, const Real time,
                              const Vector<BCRec>& bcr, const int bcomp,
                              const int orig_comp, FF&& fillfunc)
{
    const IntVect& len = bx.length();

    IndexType idxType = bx.ixType();
    Box const& domain = amrex::convert(geom.Domain(),idxType);
    Box gdomain = domain;
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        if (geom.isPeriodic(idim)) {
            gdomain.grow(idim,len[idim]);
        }
    }

    if (gdomain.contains(bx)) return;

    Array4<Real> const& fab = dest.array();
    const auto geomdata = geom.data();

#ifdef AMREX_USE_GPU
    AsyncArray<BCRec> bcr_aa(bcr.data()+bcomp, numcomp);
    BCRec* bcr_p = bcr_aa.data();

    const auto f_user = m_user_f;

    // fill on the faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = { AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                             amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) };

        Vector<Box> face_boxes;
        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) face_boxes.push_back(tmp);
        }
        const int n_face_boxes = face_boxes.size();
        if (n_face_boxes == 1) {
            amrex::ParallelFor(face_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_face_boxes > 1) {
            AsyncArray<Box> face_boxes_aa(face_boxes.data(), n_face_boxes);
            Box* boxes_p = face_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : face_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_face_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif
        Vector<Box> edge_boxes;
        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) edge_boxes.push_back(tmp);
        }
        const int n_edge_boxes = edge_boxes.size();
        if (n_edge_boxes == 1) {
            amrex::ParallelFor(edge_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                AMREX_D_PICK(amrex::ignore_unused(j,k),amrex::ignore_unused(k),(void)0);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_edge_boxes > 1) {
            AsyncArray<Box> edge_boxes_aa(edge_boxes.data(), n_edge_boxes);
            Box* boxes_p = edge_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : edge_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_edge_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        Vector<Box> corner_boxes;
        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            if (tmp.ok()) corner_boxes.push_back(tmp);
        }
        const int n_corner_boxes = corner_boxes.size();
        if (n_corner_boxes == 1) {
            amrex::ParallelFor(corner_boxes[0],
            [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        } else if (n_corner_boxes > 1) {
            AsyncArray<Box> corner_boxes_aa(corner_boxes.data(), n_corner_boxes);
            Box* boxes_p = corner_boxes_aa.data();
            Long ncounts = 0;
            for (const auto& b : corner_boxes) {
                ncounts += b.numPts();
            }
            amrex::ParallelFor(ncounts,
            [=] AMREX_GPU_DEVICE (Long icount) noexcept
            {
                const auto& idx = getCell(boxes_p, n_corner_boxes, icount);
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#else
    BCRec const* bcr_p = bcr.data()+bcomp;

    const auto& f_user = m_user_f;

    // fill on the box faces first
    {
        Array<Box,2*AMREX_SPACEDIM> dom_face_boxes
            = {{ AMREX_D_DECL(amrex::convert(amrex::adjCellLo(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellLo(gdomain, 2, len[2]),idxType)),
                 AMREX_D_DECL(amrex::convert(amrex::adjCellHi(gdomain, 0, len[0]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 1, len[1]),idxType),
                              amrex::convert(amrex::adjCellHi(gdomain, 2, len[2]),idxType)) }};

        for (const Box& b : dom_face_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }

#if (AMREX_SPACEDIM >= 2)
    // fill on the box edges
    {
#if (AMREX_SPACEDIM == 2)
        Array<Box,4> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType) }};
#else
        Array<Box,12> dom_edge_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),2,len[2]),idxType),
                 //
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(gdomain,1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(gdomain,1,len[1]),2,len[2]),idxType) }};
#endif

        for (const Box& b : dom_edge_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                amrex::ignore_unused(j,k);
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#if (AMREX_SPACEDIM == 3)
    // fill on box corners
    {
        Array<Box,8> dom_corner_boxes
            = {{ amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellLo(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellLo(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellLo(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType),
                 amrex::convert(amrex::adjCellHi(amrex::adjCellHi(amrex::adjCellHi(gdomain,0,len[0]),1,len[1]),2,len[2]),idxType) }};

        for (const Box& b : dom_corner_boxes) {
            Box tmp = b & bx;
            amrex::For(tmp, [=] (int i, int j, int k) noexcept
            {
                IntVect const idx(AMREX_D_DECL(i,j,k));
                fillfunc(idx, fab, dcomp, numcomp, domain, bcr_p, 0);
                f_user(idx, fab, dcomp, numcomp, geomdata, time,
                       bcr_p, 0, orig_comp);
            });
        }
    }
#endif

#endif
}